

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O0

int __thiscall MemFile::open(MemFile *this,char *__file,int __oflag,...)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  string *in_RCX;
  uint8_t *in_R8;
  bool local_16a;
  string local_140 [39];
  allocator<char> local_119;
  string local_118;
  string local_f8 [37];
  byte local_d3;
  byte local_d2;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_99;
  string local_98;
  string local_78 [32];
  long local_58;
  size_type pos;
  const_iterator local_48;
  uchar *local_40;
  uchar *local_38;
  uint8_t *pb;
  string *filename__local;
  string *path__local;
  char *pcStack_18;
  int len_local;
  void *buf_local;
  MemFile *this_local;
  
  local_38 = (uchar *)__file;
  pb = in_R8;
  filename__local = in_RCX;
  path__local._4_4_ = __oflag;
  pcStack_18 = __file;
  buf_local = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            (&(this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  pos = (size_type)
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  (&(this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_48,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)&pos);
  local_40 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<unsigned_char_const*,void>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                 &this->m_data,local_48,local_38,local_38 + path__local._4_4_);
  (this->m_it)._M_current = local_40;
  std::__cxx11::string::operator=((string *)this,(string *)filename__local);
  std::__cxx11::string::operator=((string *)&this->m_filename,(string *)pb);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    local_58 = std::__cxx11::string::rfind((char)this,0x2f);
    if (local_58 == -1) {
      std::__cxx11::string::string(local_78,(string *)this);
    }
    else {
      std::__cxx11::string::substr((ulong)local_78,(ulong)this);
    }
    std::__cxx11::string::operator=((string *)&this->m_filename,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::allocator();
    local_d2 = 0;
    local_d3 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"gz",&local_99);
    bVar1 = IsFileExt(&this->m_filename,&local_98);
    local_16a = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_d2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"xz",&local_d1);
      local_d3 = 1;
      local_16a = IsFileExt(&this->m_filename,&local_d0);
    }
    if ((local_d3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d0);
    }
    if ((local_d2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_d1);
    }
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    if (local_16a == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"bz2",&local_119);
      bVar1 = IsFileExt(&this->m_filename,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      uVar3 = std::allocator<char>::~allocator(&local_119);
      uVar2 = CONCAT71((int7)((ulong)uVar3 >> 8),bVar1);
      if (bVar1) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_140,(ulong)&this->m_filename);
        std::__cxx11::string::operator=((string *)&this->m_filename,local_140);
        uVar2 = std::__cxx11::string::~string(local_140);
      }
    }
    else {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_f8,(ulong)&this->m_filename);
      std::__cxx11::string::operator=((string *)&this->m_filename,local_f8);
      uVar2 = std::__cxx11::string::~string(local_f8);
    }
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),1);
}

Assistant:

bool MemFile::open(const void* buf, int len, const std::string& path_, const std::string& filename_)
{
    auto pb = reinterpret_cast<const uint8_t*>(buf);

    m_data.clear();
    m_it = m_data.insert(m_data.begin(), pb, pb + len);
    m_path = path_;
    m_filename = filename_;

    // If a filename wasn't supplied from an archive, determine it here.
    if (filename_.empty())
    {
        std::string::size_type pos = m_path.rfind(PATH_SEPARATOR_CHR);
        m_filename = (pos == m_path.npos) ? m_path : m_path.substr(pos + 1);

        // Remove the archive extension from single compressed files.
        if (IsFileExt(m_filename, "gz") || IsFileExt(m_filename, "xz"))
            m_filename = m_filename.substr(0, m_filename.size() - 3);
        else if (IsFileExt(m_filename, "bz2"))
            m_filename = m_filename.substr(0, m_filename.size() - 4);
    }

    return true;
}